

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

void Eso_ManComputeOne(Eso_Man_t *p,Vec_Int_t *vEsop1,Vec_Int_t *vEsop2,Vec_Int_t *vEsop)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int Cube;
  int Cube2;
  int Cube1;
  int k;
  int i;
  Vec_Int_t vCube2;
  Vec_Int_t vCube1;
  Vec_Int_t *vEsop_local;
  Vec_Int_t *vEsop2_local;
  Vec_Int_t *vEsop1_local;
  Eso_Man_t *p_local;
  
  Vec_IntClear(vEsop);
  iVar1 = Vec_IntSize(vEsop1);
  if ((iVar1 != 0) && (iVar1 = Vec_IntSize(vEsop2), iVar1 != 0)) {
    Vec_IntEntry(vEsop1,0);
    Vec_IntEntry(vEsop2,0);
    for (Cube1 = 0; iVar1 = Vec_IntSize(vEsop1), Cube1 < iVar1; Cube1 = Cube1 + 1) {
      iVar1 = Vec_IntEntry(vEsop1,Cube1);
      if (iVar1 == p->Cube1) {
        for (Cube2 = 0; iVar1 = Vec_IntSize(vEsop2), Cube2 < iVar1; Cube2 = Cube2 + 1) {
          iVar1 = Vec_IntEntry(vEsop2,Cube2);
          Eso_ManMinimizeAdd(p,iVar1);
        }
      }
      else {
        for (Cube2 = 0; iVar2 = Vec_IntSize(vEsop2), Cube2 < iVar2; Cube2 = Cube2 + 1) {
          iVar2 = Vec_IntEntry(vEsop2,Cube2);
          if (iVar2 == p->Cube1) {
            Eso_ManMinimizeAdd(p,iVar1);
          }
          else {
            pVVar3 = Hsh_VecReadEntry(p->pHash,iVar1);
            vCube2.pArray = *(int **)pVVar3;
            pVVar3 = Hsh_VecReadEntry(p->pHash,iVar2);
            k = pVVar3->nCap;
            unique0x00012004 = pVVar3->nSize;
            vCube2._0_8_ = pVVar3->pArray;
            iVar2 = Eso_ManComputeAnd(p,(Vec_Int_t *)&vCube2.pArray,(Vec_Int_t *)&k,p->vCube);
            if (-1 < iVar2) {
              Eso_ManMinimizeAdd(p,iVar2);
            }
          }
        }
      }
    }
    Eso_ManMinimizeCopy(p,vEsop);
  }
  return;
}

Assistant:

void Eso_ManComputeOne( Eso_Man_t * p, Vec_Int_t * vEsop1, Vec_Int_t * vEsop2, Vec_Int_t * vEsop )
{
    Vec_Int_t vCube1, vCube2;
    int i, k, Cube1, Cube2, Cube;
    Vec_IntClear( vEsop );
    if ( Vec_IntSize(vEsop1) == 0 || Vec_IntSize(vEsop2) == 0 )
        return;
    Cube1 = Vec_IntEntry(vEsop1, 0);
    Cube2 = Vec_IntEntry(vEsop2, 0);
    Vec_IntForEachEntry( vEsop1, Cube1, i )
    {
        if ( Cube1 == p->Cube1 )
        {
            Vec_IntForEachEntry( vEsop2, Cube2, k )
                Eso_ManMinimizeAdd( p, Cube2 );
            continue;
        }
        Vec_IntForEachEntry( vEsop2, Cube2, k )
        {
            if ( Cube2 == p->Cube1 )
            {
                Eso_ManMinimizeAdd( p, Cube1 );
                continue;
            }
            vCube1 = *Hsh_VecReadEntry( p->pHash, Cube1 );
            vCube2 = *Hsh_VecReadEntry( p->pHash, Cube2 );
            Cube = Eso_ManComputeAnd( p, &vCube1, &vCube2, p->vCube );
            if ( Cube >= 0 )
                Eso_ManMinimizeAdd( p, Cube );
        }
    }
    Eso_ManMinimizeCopy( p, vEsop );
}